

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O1

string * hiberlite::Database::getClassName<Person>(void)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,"Person","");
  sVar1 = in_RDI->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (in_RDI->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      if (pcVar2[sVar3] == ':') {
        pcVar2[sVar3] = '_';
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return in_RDI;
}

Assistant:

void createDB()
{
  hiberlite::Database db("sample.db");
  //register bean classes
  db.registerBeanClass<Person>();
  //drop all tables beans will use
  db.dropModel();
  //create those tables again with proper schema
  db.createModel();

  const char* names[5]={"Stanley Marsh", "Kyle Broflovski", "Eric Theodore Cartman", "Kenneth McCormick", "Leopold Stotch"};

  for(unsigned int i=0;i<5;i++) {
    Person x;
    x.name=names[i%5];
    x.age=14+i*0.1;
    x.bio.push_back("Hello");
    x.bio.push_back("world");
    x.bio.push_back("!");

    hiberlite::bean_ptr<Person> p=db.copyBean(x);	//create a managed copy of the object
  }
}